

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O2

void __thiscall flow::lang::BuiltinFunctionSym::~BuiltinFunctionSym(BuiltinFunctionSym *this)

{
  CallableSym::~CallableSym(&this->super_CallableSym);
  operator_delete(this,0xb8);
  return;
}

Assistant:

explicit BuiltinFunctionSym(const NativeCallback& cb)
      : CallableSym(Symbol::BuiltinFunction, &cb, SourceLocation()) {}